

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O0

void asmjit::ConstPool_addGap(ConstPool *self,size_t offset,size_t length)

{
  ulong *puVar1;
  ulong in_RDX;
  ulong in_RSI;
  long *in_RDI;
  Gap *gap;
  size_t gapLength;
  size_t gapIndex;
  Gap *gap_1;
  size_t remainingBytes;
  uint8_t *ptr;
  char *in_stack_00000330;
  int in_stack_0000033c;
  char *in_stack_00000340;
  long local_b8;
  long local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  long *local_40;
  long *local_8;
  
  local_a8 = in_RDX;
  local_a0 = in_RSI;
  if (in_RDX == 0) {
    DebugUtils::assertionFailed(in_stack_00000340,in_stack_0000033c,in_stack_00000330);
  }
  while( true ) {
    if (local_a8 == 0) {
      return;
    }
    local_b0 = 4;
    if ((local_a8 < 0x10) || (local_a0 % 0x10 != 0)) {
      if ((local_a8 < 8) || (in_stack_ffffffffffffff94 = 8, local_a0 % 8 != 0)) {
        if ((local_a8 < 4) || (in_stack_ffffffffffffff88 = local_a0, local_a0 % 4 != 0)) {
          if ((local_a8 < 2) || (local_a0 % 2 != 0)) {
            local_b0 = 0;
            local_b8 = 1;
          }
          else {
            local_b0 = 1;
            local_b8 = 2;
          }
        }
        else {
          local_b0 = 2;
          local_b8 = 4;
        }
      }
      else {
        local_b0 = 3;
        local_b8 = 8;
      }
    }
    else {
      local_b8 = 0x10;
    }
    local_40 = (long *)in_RDI[0x19];
    if (local_40 == (long *)0x0) {
      puVar1 = (ulong *)*in_RDI;
      local_8 = (long *)*puVar1;
      if (puVar1[1] - (long)local_8 < 0x18) {
        local_8 = (long *)Zone::_alloc((Zone *)CONCAT44(in_stack_ffffffffffffff94,
                                                        in_stack_ffffffffffffff90),
                                       in_stack_ffffffffffffff88);
      }
      else {
        *puVar1 = *puVar1 + 0x18;
        if (puVar1[1] < *puVar1) {
          DebugUtils::assertionFailed(in_stack_00000340,in_stack_0000033c,in_stack_00000330);
        }
      }
      local_40 = local_8;
    }
    else {
      in_RDI[0x19] = *local_40;
    }
    if (local_40 == (long *)0x0) break;
    *local_40 = in_RDI[local_b0 + 0x13];
    in_RDI[local_b0 + 0x13] = (long)local_40;
    local_40[1] = local_a0;
    local_40[2] = local_b8;
    local_a0 = local_b8 + local_a0;
    local_a8 = local_a8 - local_b8;
  }
  return;
}

Assistant:

static void ConstPool_addGap(ConstPool* self, size_t offset, size_t length) noexcept {
  ASMJIT_ASSERT(length > 0);

  while (length > 0) {
    size_t gapIndex;
    size_t gapLength;

      gapIndex = ConstPool::kIndex16;
    if (length >= 16 && Utils::isAligned<size_t>(offset, 16)) {
      gapLength = 16;
    }
    else if (length >= 8 && Utils::isAligned<size_t>(offset, 8)) {
      gapIndex = ConstPool::kIndex8;
      gapLength = 8;
    }
    else if (length >= 4 && Utils::isAligned<size_t>(offset, 4)) {
      gapIndex = ConstPool::kIndex4;
      gapLength = 4;
    }
    else if (length >= 2 && Utils::isAligned<size_t>(offset, 2)) {
      gapIndex = ConstPool::kIndex2;
      gapLength = 2;
    }
    else {
      gapIndex = ConstPool::kIndex1;
      gapLength = 1;
    }

    // We don't have to check for errors here, if this failed nothing really
    // happened (just the gap won't be visible) and it will fail again at
    // place where checking will cause kErrorNoHeapMemory.
    ConstPool::Gap* gap = ConstPool_allocGap(self);
    if (!gap) return;

    gap->_next = self->_gaps[gapIndex];
    self->_gaps[gapIndex] = gap;

    gap->_offset = offset;
    gap->_length = gapLength;

    offset += gapLength;
    length -= gapLength;
  }
}